

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_ParseUnknownWithTrailingComma_Test::
TextFormatTest_ParseUnknownWithTrailingComma_Test
          (TextFormatTest_ParseUnknownWithTrailingComma_Test *this)

{
  TextFormatTest::TextFormatTest(&this->super_TextFormatTest);
  (this->super_TextFormatTest).super_TextFormatTestBase.super_Test._vptr_Test =
       (_func_int **)&PTR__TextFormatTest_0163af18;
  return;
}

Assistant:

TEST_F(TextFormatTest, ParseUnknownWithTrailingComma) {
  TextFormat::Parser parser;
  parser.AllowUnknownField(true);
  parser.AllowUnknownExtension(true);

  EXPECT_TRUE(parser.ParseFromString("unknown_int: 456 ,\n", &proto_));
  EXPECT_TRUE(parser.ParseFromString("unknown_enum: FOREIGN_FOO ,", &proto_));
  EXPECT_TRUE(
      parser.ParseFromString("unknown_repeated: [ \"foo\" ] ,", &proto_));
  EXPECT_TRUE(
      parser.ParseFromString("unknown_message: { bb: 1 , } ,", &proto_));
  EXPECT_TRUE(
      parser.ParseFromString("unknown_message: { bb: 1 , } ,", &proto_));
  EXPECT_TRUE(parser.ParseFromString("[foo.unknown_extension]: 1 ,", &proto_));
}